

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelMaxSizeCase::iterate(LabelMaxSizeCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined8 uVar7;
  NotSupportedError *this_00;
  TestError *this_01;
  MessageBuilder *pMVar8;
  allocator<char> local_2c9;
  int maxLabelLen;
  int outlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  vector<char,_std::allocator<char>_> readBuffer;
  code *local_228;
  int local_220;
  ScopedLogSection section;
  vector<char,_std::allocator<char>_> buffer;
  MessageBuilder local_1f8;
  ResultCollector result;
  long lVar6;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x959);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8," // ERROR: ",(allocator<char> *)&local_2c0);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  maxLabelLen = -1;
  outlen = -1;
  (**(code **)(lVar6 + 0x868))(0x82e8);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,"Got Error ",(allocator<char> *)&readBuffer);
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)glu::getErrorName;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"GL_MAX_LABEL_LENGTH");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"GL_MAX_LABEL_LENGTH = ");
  std::ostream::operator<<(poVar1,maxLabelLen);
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (maxLabelLen < 0x100) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"maxLabelLen was less than required (256)",
               (allocator<char> *)&local_2c0);
    tcu::TestError::TestError(this_01,(string *)&local_1f8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (0x2000 < (uint)maxLabelLen) {
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
                   );
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    goto LAB_003d8309;
  }
  uVar7 = (**(code **)(lVar6 + 0x640))(0x9117,0);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,"Got Error ",(allocator<char> *)&readBuffer);
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)glu::getErrorName;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"fenceSync");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  uVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a0,"Got Error ",(allocator<char> *)&readBuffer);
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)glu::getErrorName;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"createShader");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Shader",(allocator<char> *)(local_2a0 + 0x20));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"Shader object",(allocator<char> *)local_2a0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log._0_1_ = 0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&buffer,(long)maxLabelLen,(value_type *)&local_1f8,(allocator_type *)&local_2c0);
  local_1f8.m_log = (TestLog *)CONCAT71(local_1f8.m_log._1_7_,0x58);
  std::vector<char,_std::allocator<char>_>::vector
            (&readBuffer,(long)maxLabelLen,(value_type *)&local_1f8,(allocator_type *)&local_2c0);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [maxLabelLen + -1] = '\0';
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting max length label, with implicit size. (length = -1)");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar6 + 0xfc0))
            (0x82e1,uVar5,0xffffffffffffffff,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"objectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label back");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  outlen = -1;
  (**(code **)(lVar6 + 0x958))
            (0x82e1,uVar5,maxLabelLen,&outlen,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  if (outlen == maxLabelLen + -1) {
    if (readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[outlen] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)&local_2c0
                );
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      pMVar8 = &local_1f8;
      goto LAB_003d76ef;
    }
  }
  else {
    local_228 = (code *)CONCAT44(local_228._4_4_,maxLabelLen + -1);
    de::toString<int>((string *)local_2a0,(int *)&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),"\'length\' was not ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),", got ");
    de::toString<int>(&local_260,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,&local_260);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    pMVar8 = (MessageBuilder *)local_2a0;
LAB_003d76ef:
    std::__cxx11::string::~string((string *)pMVar8);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting max length label, with explicit size. (length = ");
  std::ostream::operator<<(poVar1,maxLabelLen + -1);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar6 + 0xfc0))
            (0x82e1,uVar5,maxLabelLen + -1,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"objectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label back");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  outlen = -1;
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[maxLabelLen + -1] = 'X';
  (**(code **)(lVar6 + 0x958))
            (0x82e1,uVar5,maxLabelLen,&outlen,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  if (outlen == maxLabelLen + -1) {
    if (readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[outlen] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)&local_2c0
                );
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      pMVar8 = &local_1f8;
      goto LAB_003d7aa4;
    }
  }
  else {
    local_228 = (code *)CONCAT44(local_228._4_4_,maxLabelLen + -1);
    de::toString<int>((string *)local_2a0,(int *)&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),"\'length\' was not ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),", got ");
    de::toString<int>(&local_260,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,&local_260);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    pMVar8 = (MessageBuilder *)local_2a0;
LAB_003d7aa4:
    std::__cxx11::string::~string((string *)pMVar8);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Sync",(allocator<char> *)(local_2a0 + 0x20));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"Sync object",(allocator<char> *)local_2a0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log._0_1_ = 0x58;
  std::vector<char,_std::allocator<char>_>::vector
            (&buffer,(long)maxLabelLen,(value_type *)&local_1f8,(allocator_type *)&local_2c0);
  local_1f8.m_log = (TestLog *)CONCAT71(local_1f8.m_log._1_7_,0x58);
  std::vector<char,_std::allocator<char>_>::vector
            (&readBuffer,(long)maxLabelLen,(value_type *)&local_1f8,(allocator_type *)&local_2c0);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [maxLabelLen + -1] = '\0';
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting max length label, with implicit size. (length = -1)");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar6 + 0xfc8))
            (uVar7,0xffffffffffffffff,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"objectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label back");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  outlen = -1;
  (**(code **)(lVar6 + 0x960))
            (uVar7,maxLabelLen,&outlen,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  if (outlen == maxLabelLen + -1) {
    if (readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[outlen] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)&local_2c0
                );
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      pMVar8 = &local_1f8;
      goto LAB_003d7f0c;
    }
  }
  else {
    local_228 = (code *)CONCAT44(local_228._4_4_,maxLabelLen + -1);
    de::toString<int>((string *)local_2a0,(int *)&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),"\'length\' was not ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),", got ");
    de::toString<int>(&local_260,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,&local_260);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    pMVar8 = (MessageBuilder *)local_2a0;
LAB_003d7f0c:
    std::__cxx11::string::~string((string *)pMVar8);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting max length label, with explicit size. (length = ");
  std::ostream::operator<<(poVar1,maxLabelLen + -1);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar6 + 0xfc8))
            (uVar7,maxLabelLen + -1,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"objectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label back");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  outlen = -1;
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[maxLabelLen + -1] = 'X';
  (**(code **)(lVar6 + 0x960))
            (uVar7,maxLabelLen,&outlen,
             readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"Got Error ",&local_2c9);
    local_228 = glu::getErrorName;
    local_220 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_260,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_260);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,"getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_2a0);
  }
  if (outlen == maxLabelLen + -1) {
    if (readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[outlen] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)&local_2c0
                );
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      pMVar8 = &local_1f8;
      goto LAB_003d82b9;
    }
  }
  else {
    local_228 = (code *)CONCAT44(local_228._4_4_,maxLabelLen + -1);
    de::toString<int>((string *)local_2a0,(int *)&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),"\'length\' was not ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x20),", got ");
    de::toString<int>(&local_260,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   &local_2c0,&local_260);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
    pMVar8 = (MessageBuilder *)local_2a0;
LAB_003d82b9:
    std::__cxx11::string::~string((string *)pMVar8);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  (**(code **)(lVar6 + 0x470))(uVar5);
  (**(code **)(lVar6 + 0x478))(uVar7);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
LAB_003d8309:
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

LabelMaxSizeCase::IterateResult LabelMaxSizeCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxLabelLen	= -1;
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	gl.getIntegerv(GL_MAX_LABEL_LENGTH, &maxLabelLen);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "GL_MAX_LABEL_LENGTH");

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_LABEL_LENGTH = " << maxLabelLen << TestLog::EndMessage;

	if (maxLabelLen < 256)
		throw tcu::TestError("maxLabelLen was less than required (256)");
	if (maxLabelLen > 8192)
	{
		m_testCtx.getLog()
			<< TestLog::Message
			<< "GL_MAX_LABEL_LENGTH is very large. Application having larger labels is unlikely, skipping test."
			<< TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Shader", "Shader object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectLabel(GL_SHADER, shader, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Sync", "Sync object");
		std::vector<char>			buffer		(maxLabelLen, 'X');
		std::vector<char>			readBuffer	(maxLabelLen, 'X');

		buffer[maxLabelLen-1] = '\0';

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with implicit size. (length = -1)" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");

		m_testCtx.getLog() << TestLog::Message << "Setting max length label, with explicit size. (length = " << (maxLabelLen-1) << ")" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, maxLabelLen-1,  &buffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label back" << TestLog::EndMessage;
		outlen = -1;
		readBuffer[maxLabelLen-1] = 'X';
		gl.getObjectPtrLabel(sync, maxLabelLen, &outlen, &readBuffer[0]);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != maxLabelLen-1)
			result.fail("'length' was not " + de::toString(maxLabelLen-1) + ", got " + de::toString(outlen));
		else if (readBuffer[outlen] != '\0')
			result.fail("Buffer was not null-terminated");
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}